

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ChElementHexaANCF_3813_9(ChElementHexaANCF_3813_9 *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  
  auVar2 = ZEXT816(0) << 0x40;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  auVar3 = ZEXT1632(auVar2);
  (this->super_ChElementGeneric).Kmatr.K = (ChMatrixDynamic<double>)auVar3._0_24_;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementGeneric).Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar3;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = (_func_int **)0xb35a70;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb35b58;
  this->super_ChLoadableUVW = (ChLoadableUVW)0xb35c80;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_dimensions).m_data[0] = 0.0;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_central_node).super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_material).super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_dimensions).m_data[0] = 0.0;
  (this->m_dimensions).m_data[1] = 0.0;
  (this->m_dimensions).m_data[2] = 0.0;
  this->m_DPVector1 = (ChVectorDynamic<double>)SUB3216(ZEXT1632(auVar2),0);
  this->m_DPVector2 = (ChVectorDynamic<double>)SUB3216(ZEXT1632(auVar2),0x10);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->m_nodes,8);
  memset(&this->m_ddT,0,0x3c8);
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x20] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[2] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[3] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[4] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[5] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[6] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[7] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[8] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[9] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[10] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0xb] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0xc] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0xd] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0xe] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0xf] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x10] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x11] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x12] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x13] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x14] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x15] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x16] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x17] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x18] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x19] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1a] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1b] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1c] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1d] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1e] = 0.0;
  (this->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.
  array[0x1f] = 0.0;
  memset(&this->m_Alpha_Plast,0,0x280);
  lVar1 = (this->m_DPVector1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar1) {
    if (lVar1 != 0) {
      memset((this->m_DPVector1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar1 << 3);
    }
    lVar1 = (this->m_DPVector2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    if (-1 < lVar1) {
      if (lVar1 != 0) {
        memset((this->m_DPVector2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data,0,lVar1 << 3);
        return;
      }
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChElementHexaANCF_3813_9::ChElementHexaANCF_3813_9() {
    m_nodes.resize(8);

    m_ddT.setZero();
    m_d_dt.setZero();

    m_Alpha_Plast.setZero();
    m_CCPinv_Plast.setZero();

    m_DPVector1.setZero();
    m_DPVector2.setZero();
}